

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * operator+(Clifford *__return_storage_ptr__,float tv,Clifford *A)

{
  Clifford R;
  Blade local_60;
  vector<Blade,_std::allocator<Blade>_> local_58;
  vector<Blade,_std::allocator<Blade>_> local_40;
  vector<Blade,_std::allocator<Blade>_> local_28;
  
  local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Blade::Blade(&local_60,0,tv);
  std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>(&local_58,&local_60);
  Blade::~Blade(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_28,&local_58);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_40,A);
  operator+(__return_storage_ptr__,&local_28,&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Clifford operator+(float tv,Clifford A)
{
	Clifford R;R.push_back(Blade(0,tv));
	return (R+A);
}